

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_vlog_str(ly_ctx *ctx,LY_VLOG_ELEM elem_type,char *str,...)

{
  LY_LOG_LEVEL *pLVar1;
  ly_err_item *__src;
  char in_AL;
  char *pcVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  ly_err_item *local_58;
  ly_err_item *first;
  char *ptr;
  char *fmt;
  char *path;
  va_list ap;
  char *str_local;
  LY_VLOG_ELEM elem_type_local;
  ly_ctx *ctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  fmt = (char *)0x0;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  ap[0].reg_save_area = str;
  if ((elem_type != LY_VLOG_NONE) && (elem_type != LY_VLOG_PREV)) {
    __assert_fail("(elem_type == LY_VLOG_NONE) || (elem_type == LY_VLOG_PREV)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                  ,0x382,
                  "void ly_vlog_str(const struct ly_ctx *, enum LY_VLOG_ELEM, const char *, ...)");
  }
  if (((elem_type == LY_VLOG_PREV) && (local_58 = ly_err_first(ctx), local_58 != (ly_err_item *)0x0)
      ) && (local_58->prev->path != (char *)0x0)) {
    fmt = strdup(local_58->prev->path);
  }
  pcVar2 = strchr((char *)ap[0].reg_save_area,0x25);
  if (pcVar2 == (char *)0x0) {
    ptr = strdup((char *)ap[0].reg_save_area);
  }
  else {
    sVar3 = strlen((char *)ap[0].reg_save_area);
    ptr = (char *)malloc(sVar3 * 2 + 1);
    strcpy(ptr,(char *)ap[0].reg_save_area);
    for (first = (ly_err_item *)strchr(ptr,0x25); __src = first, first != (ly_err_item *)0x0;
        first = (ly_err_item *)strchr((char *)((long)&first->level + 2),0x25)) {
      pLVar1 = &first->level;
      sVar3 = strlen((char *)first);
      memmove((byte *)((long)pLVar1 + 1),__src,sVar3 + 1);
      *(undefined1 *)&first->level = 0x25;
    }
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  path._4_4_ = 0x30;
  path._0_4_ = 0x18;
  log_vprintf(ctx,LY_LLERR,LY_EVALID,LYVE_SUCCESS,fmt,ptr,(__va_list_tag *)&path);
  free(ptr);
  return;
}

Assistant:

void
ly_vlog_str(const struct ly_ctx *ctx, enum LY_VLOG_ELEM elem_type, const char *str, ...)
{
    va_list ap;
    char *path = NULL, *fmt, *ptr;
    const struct ly_err_item *first;

    assert((elem_type == LY_VLOG_NONE) || (elem_type == LY_VLOG_PREV));

    if (elem_type == LY_VLOG_PREV) {
        /* use previous path */
        first = ly_err_first(ctx);
        if (first && first->prev->path) {
            path = strdup(first->prev->path);
        }
    }

    if (strchr(str, '%')) {
        /* must be enough */
        fmt = malloc(2 * strlen(str) + 1);
        strcpy(fmt, str);
        for (ptr = strchr(fmt, '%'); ptr; ptr = strchr(ptr + 2, '%')) {
            memmove(ptr + 1, ptr, strlen(ptr) + 1);
            ptr[0] = '%';
        }
    } else {
        fmt = strdup(str);
    }

    va_start(ap, str);
    /* path is spent and should not be freed! */
    log_vprintf(ctx, LY_LLERR, LY_EVALID, LYVE_SUCCESS, path, fmt, ap);
    va_end(ap);

    free(fmt);
}